

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O2

void AdditiveExpression_add_common(JsValue *r2,JsValue *r4,JsContext *context,JsValue *res)

{
  undefined4 uVar1;
  size_t sVar2;
  size_t sVar3;
  char *__dest;
  undefined1 local_88 [8];
  JsValue r8;
  JsValue r9;
  JsValue r5;
  JsValue r6;
  
  JsToPrimitive(r2,0,(JsValue *)((long)&r9.u + 8));
  JsToPrimitive(r4,0,(JsValue *)((long)&r5.u + 8));
  if ((r9.u.completion.type == JS_COMPLETION_THROW) || (r5.u.completion.type == JS_COMPLETION_THROW)
     ) {
    JsToString((JsValue *)((long)&r9.u + 8),(JsValue *)local_88);
    JsToString((JsValue *)((long)&r5.u + 8),(JsValue *)((long)&r8.u + 8));
    sVar2 = strlen((char *)r8._0_8_);
    sVar3 = strlen((char *)r9._0_8_);
    __dest = (char *)JsMalloc((int)sVar3 + (int)sVar2 + 4);
    strcpy(__dest,(char *)r8._0_8_);
    strcat(__dest,(char *)r9._0_8_);
    context->scope = __dest;
    uVar1 = 4;
  }
  else {
    JsToNumber((JsValue *)((long)&r9.u + 8),(JsValue *)local_88);
    JsToNumber((JsValue *)((long)&r5.u + 8),(JsValue *)((long)&r8.u + 8));
    context->scope = (JsList)((double)r8._0_8_ + (double)r9._0_8_);
    uVar1 = 3;
  }
  *(undefined4 *)&context->engine = uVar1;
  return;
}

Assistant:

static void
AdditiveExpression_add_common(r2, r4, context, res)
	struct JsValue *r2, *r4, *res;
	struct JsContext *context;
{
	struct JsValue r5, r6,
			 r8, r9, r12, r13;
	char *s;
	//默认hit JS_OBJECT_HIT_TYPE_STRING
	JsToPrimitive(r2, JS_OBJECT_HIT_TYPE_STRING, &r5);
	JsToPrimitive(r4, JS_OBJECT_HIT_TYPE_STRING, &r6);
	if (!(r5.type == JS_STRING || r6.type== JS_STRING)){
		JsToNumber(&r5, &r8);
		JsToNumber(&r6, &r9);
		res->type = JS_NUMBER;
		res->u.number =  r8.u.number + r9.u.number;
	}else{
		JsToString(&r5, &r12);
		JsToString(&r6, &r13);
		s = (char*)JsMalloc(strlen(r12.u.string) 
			+ strlen(r13.u.string) + 4);
		strcpy(s,r12.u.string);
		strcat(s,r13.u.string);
		res->type = JS_STRING;
		res->u.string = s;
	}
}